

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int experimental_hooks_remove_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  int iVar1;
  void *opaque;
  
  iVar1 = 1;
  if (oldp == (void *)0x0 && oldlenp == (size_t *)0x0) {
    if (newp == (void *)0x0) {
      opaque = (void *)0x0;
    }
    else {
      if (newlen != 8) {
        return 0x16;
      }
      opaque = *newp;
    }
    if (opaque == (void *)0x0) {
      iVar1 = 0x16;
    }
    else {
      duckdb_je_hook_remove((tsdn_t *)tsd,opaque);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
experimental_hooks_remove_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	WRITEONLY();
	void *handle = NULL;
	WRITE(handle, void *);
	if (handle == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	hook_remove(tsd_tsdn(tsd), handle);
	ret = 0;
label_return:
	return ret;
}